

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O1

void sznet::net::defaultKcpConnectionCallback(KcpConnectionPtr *conn)

{
  ulong __n;
  StateE SVar1;
  _Tuple_impl<0UL,_sznet::net::InetAddress_*,_std::default_delete<sznet::net::InetAddress>_> _Var2;
  char *__src;
  int iVar3;
  SourceFile file;
  Logger local_1078;
  sockaddr_in6 local_a4;
  string local_88;
  anon_union_28_2_62076933_for_InetAddress_1 local_68;
  string local_40;
  
  if (g_logLevel < 1) {
    file._8_8_ = 0x11;
    file.m_data = "KcpConnection.cpp";
    Logger::Logger(&local_1078,file,0x10,TRACE,"defaultKcpConnectionCallback");
    sockets::sz_sock_getlocaladdr
              (&local_a4,
               (((conn->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->m_udpSocket).m_sockfd);
    InetAddress::toIpPort_abi_cxx11_(&local_40,(InetAddress *)&local_a4);
    iVar3 = (int)&local_1078 + 0xfb0;
    if (local_40._M_string_length <
        (ulong)(long)(iVar3 - (int)local_1078.m_impl.m_stream.m_buffer.m_cur)) {
      memcpy(local_1078.m_impl.m_stream.m_buffer.m_cur,local_40._M_dataplus._M_p,
             local_40._M_string_length);
      local_1078.m_impl.m_stream.m_buffer.m_cur =
           local_1078.m_impl.m_stream.m_buffer.m_cur + local_40._M_string_length;
    }
    if (4 < (uint)(iVar3 - (int)local_1078.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_1078.m_impl.m_stream.m_buffer.m_cur," -> ",4);
      local_1078.m_impl.m_stream.m_buffer.m_cur = local_1078.m_impl.m_stream.m_buffer.m_cur + 4;
    }
    _Var2.super__Head_base<0UL,_sznet::net::InetAddress_*,_false>._M_head_impl =
         (((conn->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
         ->m_peerAddr)._M_t.
         super___uniq_ptr_impl<sznet::net::InetAddress,_std::default_delete<sznet::net::InetAddress>_>
         ._M_t.
         super__Tuple_impl<0UL,_sznet::net::InetAddress_*,_std::default_delete<sznet::net::InetAddress>_>
         .super__Head_base<0UL,_sznet::net::InetAddress_*,_false>;
    if (_Var2.super__Head_base<0UL,_sznet::net::InetAddress_*,_false>._M_head_impl ==
        (InetAddress *)0x0) {
      InetAddress::InetAddress((InetAddress *)&local_68.m_addr,0,false,false);
    }
    else {
      local_68._0_8_ =
           *(undefined8 *)_Var2.super__Head_base<0UL,_sznet::net::InetAddress_*,_false>._M_head_impl
      ;
      local_68._20_8_ =
           *(undefined8 *)
            ((long)_Var2.super__Head_base<0UL,_sznet::net::InetAddress_*,_false>._M_head_impl + 0x14
            );
      local_68._16_4_ =
           (undefined4)
           ((ulong)*(undefined8 *)
                    ((long)_Var2.super__Head_base<0UL,_sznet::net::InetAddress_*,_false>.
                           _M_head_impl + 0xc) >> 0x20);
      local_68._8_4_ =
           (undefined4)
           *(undefined8 *)
            ((long)_Var2.super__Head_base<0UL,_sznet::net::InetAddress_*,_false>._M_head_impl + 8);
      local_68._12_4_ =
           (undefined4)
           ((ulong)*(undefined8 *)
                    ((long)_Var2.super__Head_base<0UL,_sznet::net::InetAddress_*,_false>.
                           _M_head_impl + 8) >> 0x20);
    }
    InetAddress::toIpPort_abi_cxx11_(&local_88,(InetAddress *)&local_68.m_addr);
    if (local_88._M_string_length <
        (ulong)(long)(iVar3 - (int)local_1078.m_impl.m_stream.m_buffer.m_cur)) {
      memcpy(local_1078.m_impl.m_stream.m_buffer.m_cur,local_88._M_dataplus._M_p,
             local_88._M_string_length);
      local_1078.m_impl.m_stream.m_buffer.m_cur =
           local_1078.m_impl.m_stream.m_buffer.m_cur + local_88._M_string_length;
    }
    if (4 < (uint)(iVar3 - (int)local_1078.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_1078.m_impl.m_stream.m_buffer.m_cur," is ",4);
      local_1078.m_impl.m_stream.m_buffer.m_cur = local_1078.m_impl.m_stream.m_buffer.m_cur + 4;
    }
    SVar1 = ((conn->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->m_state;
    __n = (ulong)(SVar1 != kConnected) * 2 + 2;
    if (__n < (ulong)(long)(iVar3 - (int)local_1078.m_impl.m_stream.m_buffer.m_cur)) {
      __src = "DOWN";
      if (SVar1 == kConnected) {
        __src = "UP";
      }
      memcpy(local_1078.m_impl.m_stream.m_buffer.m_cur,__src,__n);
      local_1078.m_impl.m_stream.m_buffer.m_cur = local_1078.m_impl.m_stream.m_buffer.m_cur + __n;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    Logger::~Logger(&local_1078);
  }
  return;
}

Assistant:

void defaultKcpConnectionCallback(const KcpConnectionPtr& conn)
{
	LOG_TRACE << conn->localAddress().toIpPort() << " -> "
		<< conn->peerAddress().toIpPort() << " is "
		<< (conn->connected() ? "UP" : "DOWN");
	// do not call conn->forceClose(), because some users want to register message callback only.
}